

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_common_keywords.cpp
# Opt level: O1

PGScanKeyword *
duckdb_libpgquery::ScanKeywordLookup(char *text,PGScanKeyword *keywords,int num_keywords)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  char *__s2;
  ulong uVar5;
  PGScanKeyword *pPVar6;
  byte bVar7;
  PGScanKeyword *pPVar8;
  PGScanKeyword *pPVar9;
  
  sVar3 = strlen(text);
  uVar4 = (long)((sVar3 << 0x20) + 0x100000000) >> 0x20;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (long)uVar4) {
    uVar5 = uVar4;
  }
  __s2 = (char *)operator_new__(uVar5);
  if (0 < (int)(uint)sVar3) {
    uVar5 = 0;
    do {
      bVar1 = text[uVar5];
      bVar7 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar7 = bVar1;
      }
      __s2[uVar5] = bVar7;
      uVar5 = uVar5 + 1;
    } while (((uint)sVar3 & 0x7fffffff) != uVar5);
  }
  __s2[(long)(sVar3 << 0x20) >> 0x20] = '\0';
  pPVar8 = keywords + (long)num_keywords + -1;
  do {
    if (pPVar8 < keywords) {
      pPVar9 = (PGScanKeyword *)0x0;
      break;
    }
    uVar5 = ((long)pPVar8 - (long)keywords >> 4) - ((long)pPVar8 - (long)keywords >> 0x3f) &
            0xfffffffffffffffe;
    pPVar9 = (PGScanKeyword *)(&keywords->name + uVar5);
    iVar2 = strcmp(pPVar9->name,__s2);
    pPVar6 = (PGScanKeyword *)(&keywords[1].name + uVar5);
    if (-1 < iVar2) {
      pPVar6 = keywords;
    }
    if (0 < iVar2) {
      pPVar8 = (PGScanKeyword *)(&keywords[-1].name + uVar5);
    }
    keywords = pPVar6;
  } while (iVar2 != 0);
  operator_delete__(__s2);
  return pPVar9;
}

Assistant:

const PGScanKeyword *ScanKeywordLookup(const char *text, const PGScanKeyword *keywords, int num_keywords) {
	int len, i;
	const PGScanKeyword *low;
	const PGScanKeyword *high;

	len = strlen(text);
	auto data = std::unique_ptr<char[]>(new char[len + 1]);
	auto word = data.get();
	/* We assume all keywords are shorter than NAMEDATALEN. */

	/*
	 * Apply an ASCII-only downcasing.  We must not use tolower() since it may
	 * produce the wrong translation in some locales (eg, Turkish).
	 */
	for (i = 0; i < len; i++) {
		char ch = text[i];

		if (ch >= 'A' && ch <= 'Z')
			ch += 'a' - 'A';
		word[i] = ch;
	}
	word[len] = '\0';

	/*
	 * Now do a binary search using plain strcmp() comparison.
	 */
	low = keywords;
	high = keywords + (num_keywords - 1);
	while (low <= high) {
		const PGScanKeyword *middle;
		int difference;

		middle = low + (high - low) / 2;
		difference = strcmp(middle->name, word);
		if (difference == 0)
			return middle;
		else if (difference < 0)
			low = middle + 1;
		else
			high = middle - 1;
	}

	return NULL;
}